

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::removeNamedItemNS
          (DOMNamedNodeMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLSize_t XVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  long *plVar8;
  long lVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMException *this_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar10;
  XMLCh *pXVar11;
  ulong uVar12;
  DOMNode *pDVar13;
  ulong index;
  MemoryManager **ppMVar14;
  bool bVar15;
  DOMNode *local_48;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  bVar4 = readOnly(this);
  if (bVar4) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar14 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_03,iVar5) != 0)) {
      iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      ppMVar14 = (MemoryManager **)(CONCAT44(extraout_var_04,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,7,0,*ppMVar14);
  }
  else {
    bVar4 = false;
    uVar12 = 0;
    do {
      if (this->fBuckets[uVar12] != (DOMNodeVector *)0x0) {
        iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        XVar3 = this->fBuckets[uVar12]->nextFreeSlot;
        if (XVar3 == 0) {
          bVar15 = true;
        }
        else {
          lVar10 = CONCAT44(extraout_var,iVar5) + 0x18;
          if (CONCAT44(extraout_var,iVar5) == 0) {
            lVar10 = 0;
          }
          index = 0;
          do {
            if (index < this->fBuckets[uVar12]->nextFreeSlot) {
              pDVar13 = this->fBuckets[uVar12]->data[index];
            }
            else {
              pDVar13 = (DOMNode *)0x0;
            }
            iVar5 = (*pDVar13->_vptr_DOMNode[0x16])(pDVar13);
            pXVar6 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
            iVar5 = (*pDVar13->_vptr_DOMNode[0x18])(pDVar13);
            pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
            if (pXVar6 == namespaceURI) {
LAB_00279240:
              if (pXVar7 != localName) {
                pXVar6 = pXVar7;
                if ((localName == (XMLCh *)0x0) || (pXVar11 = localName, pXVar7 == (XMLCh *)0x0)) {
                  if (localName == (XMLCh *)0x0) {
                    if (pXVar7 == (XMLCh *)0x0) goto LAB_002792aa;
LAB_0027929b:
                    bVar15 = *pXVar6 == L'\0';
                  }
                  else {
                    bVar15 = *localName == L'\0';
                    if (bVar15 && pXVar7 != (XMLCh *)0x0) goto LAB_0027929b;
                  }
                  if (bVar15) goto LAB_002792aa;
                }
                else {
                  do {
                    XVar1 = *pXVar11;
                    if (XVar1 == L'\0') goto LAB_0027929b;
                    XVar2 = *pXVar6;
                    pXVar6 = pXVar6 + 1;
                    pXVar11 = pXVar11 + 1;
                  } while (XVar1 == XVar2);
                }
                iVar5 = 0;
                if (pXVar7 != (XMLCh *)0x0) goto LAB_0027936c;
                iVar5 = (*pDVar13->_vptr_DOMNode[2])(pDVar13);
                pXVar6 = (XMLCh *)CONCAT44(extraout_var_02,iVar5);
                if (pXVar6 == localName) goto LAB_002792aa;
                iVar5 = 0;
                if ((localName != (XMLCh *)0x0) && (pXVar7 = localName, pXVar6 != (XMLCh *)0x0)) {
                  do {
                    XVar1 = *pXVar7;
                    if (XVar1 == L'\0') goto LAB_002793f1;
                    XVar2 = *pXVar6;
                    pXVar6 = pXVar6 + 1;
                    pXVar7 = pXVar7 + 1;
                  } while (XVar1 == XVar2);
                  goto LAB_0027936c;
                }
                if (localName == (XMLCh *)0x0) {
                  if (pXVar6 == (XMLCh *)0x0) goto LAB_002792aa;
LAB_002793f1:
                  bVar15 = *pXVar6 == L'\0';
                }
                else {
                  bVar15 = *localName == L'\0';
                  if (bVar15 && pXVar6 != (XMLCh *)0x0) goto LAB_002793f1;
                }
                if (!bVar15) goto LAB_0027936c;
              }
LAB_002792aa:
              DOMNodeVector::removeElementAt(this->fBuckets[uVar12],index);
              plVar8 = (long *)__dynamic_cast(pDVar13,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                              0xfffffffffffffffe);
              if ((plVar8 == (long *)0x0) ||
                 (lVar9 = (**(code **)(*plVar8 + 0x10))(plVar8), lVar9 == 0)) {
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
                goto LAB_002794a5;
              }
              lVar9 = (**(code **)(*plVar8 + 0x10))(plVar8);
              *(long *)(lVar9 + 8) = lVar10;
              plVar8 = (long *)__dynamic_cast(pDVar13,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                              0xfffffffffffffffe);
              if ((plVar8 == (long *)0x0) ||
                 (lVar9 = (**(code **)(*plVar8 + 0x10))(plVar8), lVar9 == 0)) {
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
                goto LAB_002794a5;
              }
              lVar9 = (**(code **)(*plVar8 + 0x10))(plVar8);
              *(ushort *)(lVar9 + 0x10) = *(ushort *)(lVar9 + 0x10) & 0xfff7;
              iVar5 = 1;
              local_48 = pDVar13;
            }
            else {
              pXVar11 = namespaceURI;
              if ((namespaceURI == (XMLCh *)0x0) || (pXVar6 == (XMLCh *)0x0)) {
                if (pXVar6 == (XMLCh *)0x0) {
                  if (namespaceURI == (XMLCh *)0x0) goto LAB_00279240;
LAB_0027922b:
                  bVar15 = *pXVar11 == L'\0';
                }
                else {
                  bVar15 = *pXVar6 == L'\0';
                  if ((namespaceURI != (XMLCh *)0x0) && (*pXVar6 == L'\0')) goto LAB_0027922b;
                }
                iVar5 = 7;
                if (bVar15) goto LAB_00279240;
              }
              else {
                do {
                  XVar1 = *pXVar6;
                  if (XVar1 == L'\0') goto LAB_0027922b;
                  pXVar6 = pXVar6 + 1;
                  XVar2 = *pXVar11;
                  pXVar11 = pXVar11 + 1;
                } while (XVar1 == XVar2);
                iVar5 = 7;
              }
            }
LAB_0027936c:
            if ((iVar5 != 7) && (iVar5 != 0)) goto LAB_00279408;
            index = index + 1;
          } while (index != XVar3);
          iVar5 = 0;
LAB_00279408:
          bVar15 = iVar5 == 0;
        }
        if (!bVar15) break;
      }
      bVar4 = 0xbf < uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0xc1);
    if (!bVar4) {
      return local_48;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar14 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_05,iVar5) != 0)) {
      iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      ppMVar14 = (MemoryManager **)(CONCAT44(extraout_var_06,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,8,0,*ppMVar14);
  }
LAB_002794a5:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMNamedNodeMapImpl::removeNamedItemNS(const XMLCh *namespaceURI,
                                                 const XMLCh *localName)
{
    if (this->readOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        DOMDocument *doc = fOwnerNode->getOwnerDocument();
        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->removeElementAt(i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    return 0;
}